

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void gc_traverse_trace(global_State *g,GCtrace *T)

{
  GCobj *pGVar1;
  ulong uVar2;
  
  if (T->traceno != 0) {
    for (uVar2 = (ulong)T->nk; uVar2 < 0x7ffd; uVar2 = uVar2 + 1) {
      if ((*(char *)((long)T->ir + uVar2 * 8 + 5) == '\x17') &&
         (pGVar1 = (GCobj *)(ulong)T->ir[uVar2].field_1.op12, ((pGVar1->gch).marked & 3) != 0)) {
        gc_mark(g,pGVar1);
      }
    }
    if (T->link != 0) {
      gc_marktrace(g,(uint)T->link);
    }
    if (T->nextroot != 0) {
      gc_marktrace(g,(uint)T->nextroot);
    }
    if (T->nextside != 0) {
      gc_marktrace(g,(uint)T->nextside);
    }
    pGVar1 = (GCobj *)(ulong)(T->startpt).gcptr32;
    if (((pGVar1->gch).marked & 3) != 0) {
      gc_mark(g,pGVar1);
      return;
    }
  }
  return;
}

Assistant:

static void gc_traverse_trace(global_State *g, GCtrace *T)
{
  IRRef ref;
  if (T->traceno == 0) return;
  for (ref = T->nk; ref < REF_TRUE; ref++) {
    IRIns *ir = &T->ir[ref];
    if (ir->o == IR_KGC)
      gc_markobj(g, ir_kgc(ir));
  }
  if (T->link) gc_marktrace(g, T->link);
  if (T->nextroot) gc_marktrace(g, T->nextroot);
  if (T->nextside) gc_marktrace(g, T->nextside);
  gc_markobj(g, gcref(T->startpt));
}